

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O3

void binbuf_gettext(_binbuf *x,char **bufp,int *lengthp)

{
  char cVar1;
  uint uVar2;
  char *old;
  size_t sVar3;
  char *pcVar5;
  int iVar6;
  size_t oldsize;
  int iVar7;
  size_t sVar8;
  t_atom *a;
  char string [1000];
  char local_418 [1000];
  ulong uVar4;
  
  iVar7 = 0;
  old = (char *)getbytes(0);
  iVar6 = x->b_n;
  if (iVar6 != 0) {
    a = x->b_vec;
    uVar4 = 0;
    do {
      iVar7 = (int)uVar4;
      sVar8 = uVar4;
      if (a->a_type == A_SEMI) {
        if (iVar7 == 0) {
          sVar8 = 0;
        }
        else {
LAB_001680be:
          if (old[(long)iVar7 + -1] == ' ') {
            sVar8 = (ulong)(iVar7 - 1);
          }
        }
      }
      else if (iVar7 != 0 && a->a_type == A_COMMA) goto LAB_001680be;
      atom_string(a,local_418,1000);
      sVar3 = strlen(local_418);
      iVar7 = (int)sVar8;
      uVar2 = (int)sVar3 + iVar7 + 1;
      uVar4 = (ulong)uVar2;
      pcVar5 = (char *)resizebytes(old,(long)iVar7,(long)(int)uVar2);
      if (pcVar5 == (char *)0x0) break;
      strcpy(pcVar5 + iVar7,local_418);
      cVar1 = '\n';
      if (a->a_type != A_SEMI) {
        cVar1 = ' ';
      }
      iVar6 = iVar6 + -1;
      pcVar5[iVar7 + (int)sVar3] = cVar1;
      a = a + 1;
      old = pcVar5;
      sVar8 = uVar4;
    } while (iVar6 != 0);
    iVar7 = (int)sVar8;
    if (iVar7 == 0) {
      iVar7 = 0;
    }
    else {
      oldsize = (size_t)iVar7;
      if (old[oldsize - 1] == ' ') {
        pcVar5 = (char *)resizebytes(old,oldsize,oldsize - 1);
        if (pcVar5 != (char *)0x0) {
          sVar8 = oldsize - 1;
        }
        iVar7 = (int)sVar8;
        if (pcVar5 != (char *)0x0) {
          old = pcVar5;
        }
      }
    }
  }
  *bufp = old;
  *lengthp = iVar7;
  return;
}

Assistant:

void binbuf_gettext(const t_binbuf *x, char **bufp, int *lengthp)
{
    char *buf = getbytes(0), *newbuf;
    int length = 0;
    char string[MAXPDSTRING];
    const t_atom *ap;
    int indx;

    for (ap = x->b_vec, indx = x->b_n; indx--; ap++)
    {
        int newlength;
        if ((ap->a_type == A_SEMI || ap->a_type == A_COMMA) &&
                length && buf[length-1] == ' ') length--;
        atom_string(ap, string, MAXPDSTRING);
        newlength = length + (int)strlen(string) + 1;
        if (!(newbuf = resizebytes(buf, length, newlength))) break;
        buf = newbuf;
        strcpy(buf + length, string);
        length = newlength;
        if (ap->a_type == A_SEMI) buf[length-1] = '\n';
        else buf[length-1] = ' ';
    }
    if (length && buf[length-1] == ' ')
    {
        if ((newbuf = t_resizebytes(buf, length, length-1)))
        {
            buf = newbuf;
            length--;
        }
    }
    *bufp = buf;
    *lengthp = length;
}